

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O1

void ximu::PacketConstruction::
     constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (DateTimeData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t sVar7;
  uchar uVar8;
  pointer puVar9;
  initializer_list<unsigned_char> __l;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  uchar local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  undefined1 local_32;
  allocator_type local_31;
  
  local_39 = '\x05';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dest.container;
  sVar7 = DateTimeData::year(data);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (((sVar7 - 2000) / 100) * -100 + sVar7) - 2000;
  sVar7 = DateTimeData::year(data);
  local_38 = (char)(sVar7 - 2000) + (char)((sVar7 - 2000) / 10) * -10 |
             (byte)(SUB164(auVar1 * ZEXT816(0x199999999999999a),8) << 4);
  sVar7 = DateTimeData::month(data);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar7 % 100;
  sVar7 = DateTimeData::month(data);
  local_37 = (char)sVar7 + (char)(sVar7 / 10) * -10 |
             (byte)(SUB164(auVar2 * ZEXT816(0x199999999999999a),8) << 4);
  sVar7 = DateTimeData::day(data);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar7 % 100;
  sVar7 = DateTimeData::day(data);
  local_36 = (char)sVar7 + (char)(sVar7 / 10) * -10 |
             (byte)(SUB164(auVar3 * ZEXT816(0x199999999999999a),8) << 4);
  sVar7 = DateTimeData::hours(data);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar7 % 100;
  sVar7 = DateTimeData::hours(data);
  local_35 = (char)sVar7 + (char)(sVar7 / 10) * -10 |
             (byte)(SUB164(auVar4 * ZEXT816(0x199999999999999a),8) << 4);
  sVar7 = DateTimeData::minutes(data);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar7 % 100;
  sVar7 = DateTimeData::minutes(data);
  local_34 = (char)sVar7 + (char)(sVar7 / 10) * -10 |
             (byte)(SUB164(auVar5 * ZEXT816(0x199999999999999a),8) << 4);
  sVar7 = DateTimeData::seconds(data);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar7 % 100;
  sVar7 = DateTimeData::seconds(data);
  local_33 = (char)sVar7 + (char)(sVar7 / 10) * -10 |
             (byte)(SUB164(auVar6 * ZEXT816(0x199999999999999a),8) << 4);
  local_32 = 0;
  __l._M_len = 8;
  __l._M_array = &local_39;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,__l,&local_31);
  if (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + ~(ulong)local_60 == (pointer)0x0) {
    uVar8 = '\0';
  }
  else {
    puVar9 = (pointer)0x0;
    uVar8 = '\0';
    do {
      uVar8 = uVar8 + *(uchar *)((long)local_60 + (long)puVar9);
      puVar9 = puVar9 + 1;
    } while (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + ~(ulong)local_60 != puVar9);
  }
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar8;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_60,
             (long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)local_60,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

static void constructWriteDateTimePacket(const DateTimeData& data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_DATETIME),
    static_cast<unsigned char>((((((data.year() - 2000) % 100) / 10) << 4)
      | (data.year() - 2000) % 10)),
    static_cast<unsigned char>(((((data.month() % 100) / 10) << 4)
      | (data.month() % 10))),
    static_cast<unsigned char>(((((data.day() % 100) / 10) << 4)	
      | (data.day() % 10))),
    static_cast<unsigned char>(((((data.hours() % 100) / 10) << 4)
      | (data.hours() % 10))),
    static_cast<unsigned char>(((((data.minutes() % 100) / 10) << 4)
      | (data.minutes() % 10))),
     static_cast<unsigned char>(((((data.seconds() % 100) / 10) << 4)
      | (data.seconds() % 10))),
      0
  };
  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}